

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::session_stats_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,session_stats_alert *this)

{
  bool bVar1;
  ulong uVar2;
  long *plVar3;
  char *__format;
  long v;
  long *__end1;
  long *__begin1;
  span<const_long> *__range1;
  bool first;
  allocator<char> local_6a;
  undefined1 local_69;
  undefined1 local_68 [8];
  span<const_long> cnt;
  char msg [50];
  session_stats_alert *this_local;
  string *ret;
  
  _local_68 = counters(this);
  uVar2 = span<const_long>::size((span<const_long> *)local_68);
  snprintf((char *)&cnt.m_len,0x32,"session stats (%d values): ",uVar2 & 0xffffffff);
  local_69 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&cnt.m_len,&local_6a);
  std::allocator<char>::~allocator(&local_6a);
  bVar1 = true;
  __end1 = span<const_long>::begin((span<const_long> *)local_68);
  plVar3 = span<const_long>::end((span<const_long> *)local_68);
  for (; __end1 != plVar3; __end1 = __end1 + 1) {
    __format = ", %ld";
    if (bVar1) {
      __format = "%ld";
    }
    snprintf((char *)&cnt.m_len,0x32,__format,*__end1);
    bVar1 = false;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)&cnt.m_len);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string session_stats_alert::message() const
	{
		char msg[50];
		auto cnt = counters();
		std::snprintf(msg, sizeof(msg), "session stats (%d values): " , int(cnt.size()));
		std::string ret = msg;
		bool first = true;
		for (auto v : cnt)
		{
			std::snprintf(msg, sizeof(msg), first ? "%" PRId64 : ", %" PRId64, v);
			first = false;
			ret += msg;
		}
		return ret;
	}